

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_eqv_mips64
               (TCGContext_conflict5 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t oprsz,uint32_t maxsz)

{
  if (aofs == bofs) {
    do_dup(tcg_ctx,0,dofs,oprsz,maxsz,(TCGv_i32)0x0,(TCGv_i64)0x0,0xff);
  }
  else {
    tcg_gen_gvec_3_mips64(tcg_ctx,dofs,aofs,bofs,oprsz,maxsz,&tcg_gen_gvec_eqv_mips64::g);
  }
  return;
}

Assistant:

void tcg_gen_gvec_eqv(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                      uint32_t bofs, uint32_t oprsz, uint32_t maxsz)
{
    static const GVecGen3 g = {
        .fni8 = tcg_gen_eqv_i64,
        .fniv = tcg_gen_eqv_vec,
        .fno = gen_helper_gvec_eqv,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };

    if (aofs == bofs) {
        tcg_gen_gvec_dup8i(tcg_ctx, dofs, oprsz, maxsz, -1);
    } else {
        tcg_gen_gvec_3(tcg_ctx, dofs, aofs, bofs, oprsz, maxsz, &g);
    }
}